

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Demo6502.cpp
# Opt level: O3

void __thiscall DemoM6502::DemoM6502(DemoM6502 *this)

{
  _Rb_tree_header *p_Var1;
  
  olc::PixelGameEngine::PixelGameEngine(&this->super_PixelGameEngine);
  (this->super_PixelGameEngine)._vptr_PixelGameEngine = (_func_int **)&PTR__DemoM6502_00130a08;
  (this->cart).super___shared_ptr<Catridge,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->cart).super___shared_ptr<Catridge,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Bus::Bus(&this->nes);
  p_Var1 = &(this->mapAsm)._M_t._M_impl.super__Rb_tree_header;
  (this->mapAsm)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapAsm)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapAsm)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mapAsm)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mapAsm)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->bEmulationRun = false;
  this->fResidualTime = 0.0;
  this->nSelectedPalette = '\0';
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_PixelGameEngine).sAppName,0,
             (char *)(this->super_PixelGameEngine).sAppName._M_string_length,0x12863b);
  return;
}

Assistant:

DemoM6502() { sAppName = "m6502 Demonstration"; }